

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubkey.cpp
# Opt level: O0

bool __thiscall CPubKey::Decompress(CPubKey *this)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  uchar *in_RDI;
  long in_FS_OFFSET;
  size_t publen;
  uchar pub [65];
  secp256k1_pubkey pubkey;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  uchar *pbegin;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  size_t in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  secp256k1_pubkey *in_stack_ffffffffffffffa0;
  secp256k1_context *in_stack_ffffffffffffffa8;
  uchar *in_stack_ffffffffffffffb0;
  secp256k1_context *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pbegin = in_RDI;
  bVar2 = IsValid((CPubKey *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
  if (bVar2) {
    size((CPubKey *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
    iVar3 = secp256k1_ec_pubkey_parse
                      (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                       (uchar *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                       in_stack_ffffffffffffff90);
    if (iVar3 == 0) {
      bVar2 = false;
    }
    else {
      secp256k1_ec_pubkey_serialize
                (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                 (size_t *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                 in_stack_ffffffffffffff9c);
      Set<unsigned_char*>((CPubKey *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),
                          pbegin,in_RDI);
      bVar2 = true;
    }
  }
  else {
    bVar2 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool CPubKey::Decompress() {
    if (!IsValid())
        return false;
    secp256k1_pubkey pubkey;
    if (!secp256k1_ec_pubkey_parse(secp256k1_context_static, &pubkey, vch, size())) {
        return false;
    }
    unsigned char pub[SIZE];
    size_t publen = SIZE;
    secp256k1_ec_pubkey_serialize(secp256k1_context_static, pub, &publen, &pubkey, SECP256K1_EC_UNCOMPRESSED);
    Set(pub, pub + publen);
    return true;
}